

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_utils.cc
# Opt level: O2

int parseFilterArguments(int argc,char **argv,DeviceFilter *filter)

{
  int iVar1;
  invalid_argument *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string p;
  
  if (argc == 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"-f expects an option");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,*argv,(allocator<char> *)&bStack_58);
  iVar1 = std::__cxx11::string::compare((ulong)&p,0,(char *)0x5);
  if (iVar1 == 0) {
    std::__cxx11::string::substr((ulong)&bStack_58,(ulong)&p);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)filter,
               &bStack_58);
  }
  else {
    iVar1 = std::__cxx11::string::compare((ulong)&p,0,(char *)0x7);
    if (iVar1 == 0) {
      std::__cxx11::string::substr((ulong)&bStack_58,(ulong)&p);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &filter->serial,&bStack_58);
    }
    else {
      iVar1 = std::__cxx11::string::compare((ulong)&p,0,(char *)0x4);
      if (iVar1 == 0) {
        std::__cxx11::string::substr((ulong)&bStack_58,(ulong)&p);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filter->mac
                   ,&bStack_58);
      }
      else {
        iVar1 = std::__cxx11::string::compare((ulong)&p,0,(char *)0x6);
        if (iVar1 == 0) {
          std::__cxx11::string::substr((ulong)&bStack_58,(ulong)&p);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &filter->iface,&bStack_58);
        }
        else {
          iVar1 = std::__cxx11::string::compare((ulong)&p,0,(char *)0x6);
          if (iVar1 != 0) {
            piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::operator+(&bStack_58,"Unknown option for parameter -f: ",&p);
            std::invalid_argument::invalid_argument(piVar2,(string *)&bStack_58);
            __cxa_throw(piVar2,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::substr((ulong)&bStack_58,(ulong)&p);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &filter->model,&bStack_58);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&p);
  return 1;
}

Assistant:

int parseFilterArguments(int argc, char **argv, DeviceFilter &filter)
{
  if (argc == 0)
  {
    throw std::invalid_argument("-f expects an option");
  }

  const std::string p = argv[0];

  if (p.compare(0, 5, "name=") == 0)
  {
    filter.name.push_back(p.substr(5));
  }
  else if (p.compare(0, 7, "serial=") == 0)
  {
    filter.serial.push_back(p.substr(7));
  }
  else if (p.compare(0, 4, "mac=") == 0)
  {
    filter.mac.push_back(p.substr(4));
  }
  else if (p.compare(0, 6, "iface=") == 0)
  {
    filter.iface.push_back(p.substr(6));
  }
  else if (p.compare(0, 6, "model=") == 0)
  {
    filter.model.push_back(p.substr(6));
  }
  else
  {
    throw std::invalid_argument("Unknown option for parameter -f: " + p);
  }

  return 1;
}